

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

int Gia_IsoSort(Gia_IsoMan_t *p)

{
  uint nSize;
  uint uVar1;
  word *pwVar2;
  Gia_Man_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int iVar7;
  Vec_Int_t *pVVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  Gia_Obj_t *pGVar18;
  timespec ts;
  timespec local_40;
  
  iVar17 = 0;
  p->nSingles = 0;
  pVVar12 = p->vClasses2;
  pVVar12->nSize = 0;
  pVVar8 = p->vClasses;
  if (pVVar8->nSize < 2) {
    iVar7 = 0;
  }
  else {
    lVar16 = 0;
    iVar7 = 0;
    do {
      nSize = pVVar8->pArray[lVar16 + 1];
      if ((int)nSize < 2) {
        __assert_fail("nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x137,"int Gia_IsoSort(Gia_IsoMan_t *)");
      }
      iVar17 = pVVar8->pArray[lVar16];
      lVar14 = (long)iVar17;
      pwVar2 = p->pStoreW;
      uVar9 = pwVar2[lVar14];
      if ((long)uVar9 < 0) {
LAB_00750750:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pGia;
      if (pGVar3->nObjs <= (int)(uVar9 >> 0x20)) goto LAB_00750750;
      pGVar18 = pGVar3->pObjs;
      bVar6 = true;
      uVar15 = 0;
      do {
        uVar4 = pwVar2[lVar14 + uVar15];
        if (((long)uVar4 < 0) || (pGVar3->nObjs <= (int)(uVar4 >> 0x20))) goto LAB_00750750;
        uVar1 = pGVar18[uVar4 >> 0x20].Value;
        *(uint *)(pwVar2 + lVar14 + uVar15) = uVar1;
        if (uVar1 != pGVar18[uVar9 >> 0x20].Value) {
          bVar6 = false;
        }
        uVar15 = uVar15 + 1;
      } while (nSize != uVar15);
      if (bVar6) {
        Vec_IntPush(p->vClasses2,iVar17);
        Vec_IntPush(p->vClasses2,nSize);
      }
      else {
        iVar7 = clock_gettime(3,&local_40);
        if (iVar7 < 0) {
          lVar10 = 1;
        }
        else {
          lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
          lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_40.tv_sec * -1000000;
        }
        Abc_QuickSort3(p->pStoreW + lVar14,nSize,0);
        iVar7 = clock_gettime(3,&local_40);
        if (iVar7 < 0) {
          lVar11 = -1;
        }
        else {
          lVar11 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
        }
        p->timeSort = p->timeSort + lVar11 + lVar10;
        uVar9 = p->pStoreW[lVar14];
        if ((long)uVar9 < 0) goto LAB_00750750;
        if (p->pGia->nObjs <= (int)(uVar9 >> 0x20)) goto LAB_00750750;
        pGVar18 = p->pGia->pObjs + (uVar9 >> 0x20);
        lVar10 = (ulong)nSize - 1;
        iVar7 = iVar17;
        do {
          lVar14 = lVar14 + 1;
          uVar9 = p->pStoreW[lVar14];
          if ((long)uVar9 < 0) goto LAB_00750750;
          if (p->pGia->nObjs <= (int)(uVar9 >> 0x20)) goto LAB_00750750;
          pGVar5 = p->pGia->pObjs;
          if (pGVar18->Value != pGVar5[uVar9 >> 0x20].Value) {
            pGVar18 = pGVar5 + (uVar9 >> 0x20);
            iVar13 = (int)lVar14;
            if (iVar13 - iVar7 == 1) {
              uVar9 = p->pStoreW[iVar7] >> 0x20;
              if (p->pUniques[uVar9] != 0) {
                __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                              ,0x157,"int Gia_IsoSort(Gia_IsoMan_t *)");
              }
              iVar7 = p->nUniques;
              p->nUniques = iVar7 + 1;
              p->pUniques[uVar9] = iVar7;
              p->nSingles = p->nSingles + 1;
              iVar7 = iVar13;
            }
            else {
              Vec_IntPush(p->vClasses2,iVar7);
              Vec_IntPush(p->vClasses2,iVar13 - iVar7);
              iVar7 = iVar13;
            }
          }
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        iVar17 = (nSize + iVar17) - iVar7;
        if (iVar17 == 1) {
          uVar9 = p->pStoreW[iVar7] >> 0x20;
          if (p->pUniques[uVar9] != 0) {
            __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                          ,0x167,"int Gia_IsoSort(Gia_IsoMan_t *)");
          }
          iVar17 = p->nUniques;
          p->nUniques = iVar17 + 1;
          p->pUniques[uVar9] = iVar17;
          p->nSingles = p->nSingles + 1;
          iVar7 = 1;
        }
        else {
          Vec_IntPush(p->vClasses2,iVar7);
          Vec_IntPush(p->vClasses2,iVar17);
          iVar7 = 1;
        }
      }
      lVar16 = lVar16 + 2;
      pVVar8 = p->vClasses;
    } while ((int)((uint)lVar16 | 1) < pVVar8->nSize);
    pVVar12 = p->vClasses2;
    iVar17 = p->nSingles;
  }
  p->vClasses = pVVar12;
  p->vClasses2 = pVVar8;
  p->nEntries = p->nEntries - iVar17;
  return iVar7;
}

Assistant:

int Gia_IsoSort( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj, * pObj0;
    int i, k, fSameValue, iBegin, iBeginOld, nSize, nSizeNew;
    int fRefined = 0;
    abctime clk;

    // go through the equiv classes
    p->nSingles = 0;
    Vec_IntClear( p->vClasses2 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        assert( nSize > 1 );
        fSameValue = 1;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 0; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            Gia_IsoSetValue( p, iBegin+k, pObj->Value );
            if ( pObj->Value != pObj0->Value )
                fSameValue = 0;
        }
        if ( fSameValue )
        {
            Vec_IntPush( p->vClasses2, iBegin );
            Vec_IntPush( p->vClasses2, nSize );
            continue;
        }
        fRefined = 1;
        // sort objects
        clk = Abc_Clock();
        Abc_QuickSort3( p->pStoreW + iBegin, nSize, 0 );
        p->timeSort += Abc_Clock() - clk;
        // divide into new classes
        iBeginOld = iBegin;
        pObj0 = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin) );
        for ( k = 1; k < nSize; k++ )
        {
            pObj = Gia_ManObj( p->pGia, Gia_IsoGetItem(p,iBegin+k) );
            if ( pObj0->Value == pObj->Value )
                continue;
            nSizeNew = iBegin + k - iBeginOld;
            if ( nSizeNew == 1 )
            {
                assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
                p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
                p->nSingles++;
            }
            else
            {
                Vec_IntPush( p->vClasses2, iBeginOld );
                Vec_IntPush( p->vClasses2, nSizeNew );
            }
            iBeginOld = iBegin + k;
            pObj0 = pObj;
        }
        // add the last one
        nSizeNew = iBegin + k - iBeginOld;
        if ( nSizeNew == 1 )
        {
            assert( p->pUniques[Gia_IsoGetItem(p, iBeginOld)] == 0 );
            p->pUniques[Gia_IsoGetItem(p, iBeginOld)] = p->nUniques++;
            p->nSingles++;
        }
        else
        {
            Vec_IntPush( p->vClasses2, iBeginOld );
            Vec_IntPush( p->vClasses2, nSizeNew );
        }
    }

    ABC_SWAP( Vec_Int_t *, p->vClasses, p->vClasses2 );
    p->nEntries -= p->nSingles;
    return fRefined;
}